

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O0

void display_self(void)

{
  level *lev;
  boolean bVar1;
  int x_00;
  int y_00;
  int mndx;
  int local_34;
  int local_30;
  int local_2c;
  int monnum;
  int y;
  int x;
  
  lev = level;
  x_00 = (int)u.ux;
  y_00 = (int)u.uy;
  if (((u.usteed == (monst *)0x0) ||
      (((((*(uint *)&(u.usteed)->field_0x60 >> 1 & 1) != 0 && (u.uprops[0xc].intrinsic == 0)) &&
        (u.uprops[0xc].extrinsic == 0)) && (((youmonst.data)->mflags1 & 0x1000000) == 0)))) ||
     ((((*(uint *)&(u.usteed)->field_0x60 >> 7 & 1) != 0 ||
       ((*(uint *)&(u.usteed)->field_0x60 >> 9 & 1) != 0)) || (((byte)u._1052_1_ >> 5 & 1) != 0))))
  {
    if (youmonst.m_ap_type == '\0') {
      if ((u.umonnum == u.umonster) && (iflags.showrace != '\0')) {
        if ((flags.female == '\0') || (urace.femalenum == -1)) {
          local_34 = (int)urace.malenum;
        }
        else {
          local_34 = (int)urace.femalenum;
        }
        local_30 = local_34;
      }
      else {
        local_30 = obfuscate_monster(u.umonnum);
      }
      dbuf_set(level,x_00,y_00,(rm *)0x0,-1,-1,-1,-1,-1,-1,0,local_30 + 1,0,0);
    }
    else if (youmonst.m_ap_type == '\x01') {
      dbuf_set(level,x_00,y_00,(rm *)0x0,youmonst.mappearance,0,0,0,0,0,0,0,0,0);
    }
    else if (youmonst.m_ap_type == '\x02') {
      dbuf_set(level,x_00,y_00,(rm *)0x0,-1,-1,youmonst.mappearance + 1,0,0,0,0,0,0,0);
    }
    else {
      dbuf_set(level,x_00,y_00,(rm *)0x0,-1,-1,-1,-1,-1,-1,0,youmonst.mappearance + 1,0,0);
    }
  }
  else {
    if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
       ((u.umonnum != u.umonster && (bVar1 = dmgtype(youmonst.data,0x24), bVar1 != '\0')))) {
      mndx = monsndx((u.usteed)->data);
      local_2c = obfuscate_monster(mndx);
    }
    else {
      local_2c = display_rng(0x193);
    }
    dbuf_set(lev,x_00,y_00,(rm *)0x0,-1,-1,-1,-1,-1,-1,0,local_2c + 1,2,0);
  }
  return;
}

Assistant:

void display_self(void)
{
    int x = u.ux, y = u.uy;
    
    if (u.usteed && mon_visible(u.usteed)) {
	dbuf_set(level, x, y, NULL, -1, -1, -1, -1, -1, -1,
		 0, what_mon(obfuscate_monster(monsndx(u.usteed->data))) + 1,
		 MON_RIDDEN, 0);
    } else if (youmonst.m_ap_type == M_AP_NOTHING) {
	int monnum = (Upolyd || !iflags.showrace) ? obfuscate_monster(u.umonnum) :
	             (flags.female && urace.femalenum != NON_PM) ? urace.femalenum :
	             urace.malenum;
	dbuf_set(level, x, y, NULL, -1, -1, -1, -1, -1, -1,
		 0, monnum + 1, 0, 0);
    } else if (youmonst.m_ap_type == M_AP_FURNITURE) {
	dbuf_set(level, x, y, NULL, youmonst.mappearance, 0, 0, 0, 0, 0,
		 0, 0, 0, 0);
    } else if (youmonst.m_ap_type == M_AP_OBJECT) {
	dbuf_set(level, x, y, NULL, -1, -1, youmonst.mappearance + 1, 0, 0, 0,
		 0, 0, 0, 0);
    } else /* M_AP_MONSTER */
	dbuf_set(level, x, y, NULL, -1, -1, -1, -1, -1, -1,
		 0, youmonst.mappearance + 1, 0, 0);
}